

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LPTF.cpp
# Opt level: O3

Result * __thiscall
LongestProcessingTimeFirst::operator()
          (Result *__return_storage_ptr__,LongestProcessingTimeFirst *this,
          shared_ptr<Instance> *instance)

{
  int iVar1;
  element_type *__x;
  pointer pTVar2;
  pointer pTVar3;
  Task TVar4;
  long lVar5;
  Task *pTVar6;
  Instance *__p;
  ulong uVar7;
  __normal_iterator<Task_*,_std::vector<Task,_std::allocator<Task>_>_> __i;
  pointer pTVar8;
  shared_ptr<Instance> SortedInstance;
  shared_ptr<Instance> local_48;
  Instance *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  __p = (Instance *)operator_new(0x20);
  __x = (instance->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::vector<Task,_std::allocator<Task>_>::vector
            ((vector<Task,_std::allocator<Task>_> *)__p,&__x->tasks);
  __p->numProcessors = __x->numProcessors;
  local_38 = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Instance*>(&local_30,__p);
  pTVar2 = (local_38->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar3 = (local_38->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar2 != pTVar3) {
    uVar7 = (long)pTVar3 - (long)pTVar2 >> 3;
    lVar5 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::operator()(pTVar2,pTVar3,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pTVar3 - (long)pTVar2 < 0x81) {
      std::operator()(pTVar2,pTVar3);
    }
    else {
      pTVar8 = pTVar2 + 0x10;
      std::operator()(pTVar2,pTVar8);
      for (; pTVar8 != pTVar3; pTVar8 = pTVar8 + 1) {
        TVar4 = *pTVar8;
        iVar1 = pTVar8[-1].length;
        pTVar6 = pTVar8;
        while (iVar1 < TVar4.length) {
          *pTVar6 = pTVar6[-1];
          iVar1 = pTVar6[-2].length;
          pTVar6 = pTVar6 + -1;
        }
        *pTVar6 = TVar4;
      }
    }
  }
  local_48.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_38;
  local_48.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_30._M_pi;
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
    }
  }
  Greedy::operator()(__return_storage_ptr__,&this->super_Greedy,&local_48);
  if (local_48.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Result LongestProcessingTimeFirst::operator()(std::shared_ptr<Instance> instance) {
	//we will manipulate our Instance, so it's better to work on a copy

	std::shared_ptr<Instance> SortedInstance( new Instance(*instance) );

	//descendign sort
	std::sort(SortedInstance->tasks.begin(), SortedInstance->tasks.end(),
	[](Task& a, Task& b){return a.getLength() > b.getLength();});
	
	//descending sort ensures that Greedy Algorithm places longest possible Task in every step
	return Greedy::operator()(SortedInstance);
}